

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestGroupStats::TestGroupStats(TestGroupStats *this,TestGroupStats *param_1)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  undefined4 uVar9;
  
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_005d3ca0;
  (this->groupInfo).name._M_dataplus._M_p = (pointer)&(this->groupInfo).name.field_2;
  pcVar1 = (param_1->groupInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->groupInfo,pcVar1,pcVar1 + (param_1->groupInfo).name._M_string_length);
  sVar2 = (param_1->groupInfo).groupsCounts;
  (this->groupInfo).groupIndex = (param_1->groupInfo).groupIndex;
  (this->groupInfo).groupsCounts = sVar2;
  uVar9 = *(undefined4 *)&(param_1->totals).field_0x4;
  sVar2 = (param_1->totals).skippedTests;
  sVar3 = (param_1->totals).assertions.passed;
  sVar4 = (param_1->totals).assertions.failed;
  sVar5 = (param_1->totals).assertions.failedButOk;
  sVar6 = (param_1->totals).testCases.passed;
  sVar7 = (param_1->totals).testCases.failed;
  sVar8 = (param_1->totals).testCases.failedButOk;
  (this->totals).error = (param_1->totals).error;
  *(undefined4 *)&(this->totals).field_0x4 = uVar9;
  (this->totals).skippedTests = sVar2;
  (this->totals).assertions.passed = sVar3;
  (this->totals).assertions.failed = sVar4;
  (this->totals).assertions.failedButOk = sVar5;
  (this->totals).testCases.passed = sVar6;
  (this->totals).testCases.failed = sVar7;
  (this->totals).testCases.failedButOk = sVar8;
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::_Rb_tree(&(this->totals).skippedTestReasons._M_t,&(param_1->totals).skippedTestReasons._M_t);
  this->aborting = param_1->aborting;
  return;
}

Assistant:

TestGroupStats( TestGroupStats const& )              = default;